

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::instructionDispatchLoop
          (SelectionEvaluator *this,SelectionSet *bs,int frame)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  fd_set *__writefds;
  uint in_EDX;
  int in_ESI;
  SelectionEvaluator *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  SelectionEvaluator *unaff_retaddr;
  Token token;
  Token *in_stack_ffffffffffffff98;
  Token *this_00;
  int local_30;
  SelectionEvaluator *token_00;
  
  token_00 = in_RDI;
  do {
    uVar1 = in_RDI->pc;
    sVar3 = std::
            vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ::size(&in_RDI->aatoken);
    if (sVar3 <= uVar1) {
      return;
    }
    uVar1 = in_RDI->pc;
    in_RDI->pc = uVar1 + 1;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::operator[](&in_RDI->aatoken,(ulong)uVar1);
    this_00 = (Token *)&in_RDI->statement;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)token.value._M_manager,
               (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)token._0_8_);
    __writefds = (fd_set *)
                 std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                           ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00);
    in_RDI->statementLength = (int)__writefds;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00,0);
    Token::Token(this_00,in_stack_ffffffffffffff98);
    if (local_30 == 0x301) {
      define((SelectionEvaluator *)token.value._M_manager);
LAB_003c98d3:
      bVar2 = false;
    }
    else {
      if (local_30 == 0x302) {
        select(in_RDI,in_ESI,(fd_set *)(ulong)in_EDX,__writefds,in_R8,in_R9);
        goto LAB_003c98d3;
      }
      unrecognizedCommand(unaff_retaddr,(Token *)token_00);
      bVar2 = true;
    }
    Token::~Token((Token *)0x3c98e5);
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void SelectionEvaluator::instructionDispatchLoop(SelectionSet& bs,
                                                   int frame) {
    while (pc < aatoken.size()) {
      statement       = aatoken[pc++];
      statementLength = statement.size();
      Token token     = statement[0];
      switch (token.tok) {
      case Token::define:
        define();
        break;
      case Token::select:
        select(bs, frame);
        break;
      default:
        unrecognizedCommand(token);
        return;
      }
    }
  }